

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

void __thiscall
kj::_::ArrayJoinPromiseNodeBase::Branch::traceEvent(Branch *this,TraceBuilder *builder)

{
  PromiseNode *pPVar1;
  
  pPVar1 = (this->dependency).ptr;
  (*(pPVar1->super_PromiseArenaMember)._vptr_PromiseArenaMember[4])(pPVar1,builder,1);
  PromiseNode::OnReadyEvent::traceEvent(&this->joinNode->onReadyEvent,builder);
  return;
}

Assistant:

void ArrayJoinPromiseNodeBase::Branch::traceEvent(TraceBuilder& builder) {
  dependency->tracePromise(builder, true);
  joinNode.onReadyEvent.traceEvent(builder);
}